

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O1

int __thiscall nite::UDPSocket::open(UDPSocket *this,char *__file,int __oflag,...)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  size_type *psVar4;
  long *plVar5;
  ulong *puVar6;
  int number;
  ushort uVar7;
  int iVar8;
  ulong uVar9;
  undefined8 uVar10;
  undefined1 local_f8 [8];
  sockaddr_in addr;
  undefined1 local_d8 [16];
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string local_a8;
  ulong *local_88;
  long local_80;
  ulong local_78;
  long lStack_70;
  string local_68;
  string local_48;
  
  uVar7 = (ushort)((ulong)__file & 0xffffffff);
  this->port = uVar7;
  iVar1 = socket(2,2,0x11);
  this->sock = iVar1;
  if (iVar1 < 0) {
    print("failed to create UDP socket");
    return 0;
  }
  local_f8._0_2_ = 2;
  local_f8[4] = '\0';
  local_f8[5] = '\0';
  local_f8[6] = '\0';
  local_f8[7] = '\0';
  local_f8._2_2_ = uVar7 << 8 | uVar7 >> 8;
  iVar1 = bind(iVar1,(sockaddr *)local_f8,0x10);
  iVar8 = (int)CONCAT71((int7)(((ulong)__file & 0xffffffff) >> 8),iVar1 < 1);
  if (0 < iVar1) {
    toStr_abi_cxx11_(&local_48,(nite *)((ulong)__file & 0xffff),number);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x247e00);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_68.field_2._M_allocated_capacity = *psVar4;
      local_68.field_2._8_8_ = plVar2[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar4;
      local_68._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_68._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    print(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    ::close(this->sock);
    return iVar8;
  }
  this->opened = true;
  toStr_abi_cxx11_((string *)addr.sin_zero,(nite *)((ulong)__file & 0xffff),number);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)addr.sin_zero,0,(char *)0x0,0x247e23);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_b8 = *plVar5;
    lStack_b0 = plVar2[3];
    local_c8 = &local_b8;
  }
  else {
    local_b8 = *plVar5;
    local_c8 = (long *)*plVar2;
  }
  local_c0 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_78 = *puVar6;
    lStack_70 = plVar2[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *puVar6;
    local_88 = (ulong *)*plVar2;
  }
  local_80 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  toStr_abi_cxx11_(&local_a8,(nite *)(ulong)(uint)this->sock,(int)local_80);
  uVar9 = 0xf;
  if (local_88 != &local_78) {
    uVar9 = local_78;
  }
  if (uVar9 < local_a8._M_string_length + local_80) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      uVar10 = local_a8.field_2._M_allocated_capacity;
    }
    if (local_a8._M_string_length + local_80 <= (ulong)uVar10) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)local_88);
      goto LAB_00190e8d;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_a8._M_dataplus._M_p);
LAB_00190e8d:
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  psVar4 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_48.field_2._M_allocated_capacity = *psVar4;
    local_48.field_2._8_8_ = puVar3[3];
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar4;
    local_48._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_48._M_string_length = puVar3[1];
  *puVar3 = psVar4;
  puVar3[1] = 0;
  *(undefined1 *)psVar4 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68.field_2._8_8_ = plVar2[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar4;
    local_68._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_68._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  print(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if (addr.sin_zero != (uchar  [8])local_d8) {
    operator_delete((void *)addr.sin_zero);
  }
  return iVar8;
}

Assistant:

bool nite::UDPSocket::open(UInt16 port){
	this->port = port;
	if((sock = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP)) < 0){
		nite::print("failed to create UDP socket"); // TODO: add proper error handling
		return false;
	}
	sockaddr_in addr;
	addr.sin_family = AF_INET;
	addr.sin_addr.s_addr = INADDR_ANY;
	addr.sin_port = htons(port);
	if (bind(sock, (const sockaddr*) &addr, sizeof(sockaddr_in)) > 0){
 		nite::print("failed to bind UDP socket to port "+nite::toStr(port)); // TODO: add proper error handling
		close_(sock);
		return false;
	}
	opened = true;
	nite::print("UDP socket opened at "+nite::toStr(port)+" ("+nite::toStr(sock)+")");
	return true;
}